

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O1

uint32_t __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::append_to_codepoint
          (jsonpath_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,uint32_t cp,int c,error_code *ec)

{
  uint32_t uVar1;
  
  uVar1 = cp * 0x10;
  if (c - 0x30U < 10) {
    uVar1 = uVar1 | c - 0x30U;
  }
  else if (c - 0x61U < 6) {
    uVar1 = (uVar1 + c) - 0x57;
  }
  else if (c - 0x41U < 6) {
    uVar1 = (uVar1 + c) - 0x37;
  }
  else {
    std::error_code::operator=(ec,invalid_codepoint);
  }
  return uVar1;
}

Assistant:

uint32_t append_to_codepoint(uint32_t cp, int c, std::error_code& ec)
        {
            cp *= 16;
            if (c >= '0'  &&  c <= '9')
            {
                cp += c - '0';
            }
            else if (c >= 'a'  &&  c <= 'f')
            {
                cp += c - 'a' + 10;
            }
            else if (c >= 'A'  &&  c <= 'F')
            {
                cp += c - 'A' + 10;
            }
            else
            {
                ec = jsonpath_errc::invalid_codepoint;
            }
            return cp;
        }